

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall Instance::Instance(Instance *this,FILE *fin,ftype type)

{
  size_t in_RCX;
  FILE *ctx;
  ftype type_local;
  FILE *fin_local;
  Instance *this_local;
  
  ctx = fin;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->Ws);
  std::vector<int,_std::allocator<int>_>::vector(&this->Cs);
  std::vector<int,_std::allocator<int>_>::vector(&this->Qs);
  std::vector<Item,_std::allocator<Item>_>::vector(&this->items);
  std::vector<char,_std::allocator<char>_>::vector(&this->ctypes);
  std::vector<int,_std::allocator<int>_>::vector(&this->nopts);
  std::vector<int,_std::allocator<int>_>::vector(&this->demands);
  init(this,(EVP_PKEY_CTX *)ctx);
  read(this,(int)fin,(void *)(ulong)type,in_RCX);
  return;
}

Assistant:

Instance::Instance(FILE *fin, ftype type) {
	init();
	read(fin, type);
}